

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPARRAY ppJVar7;
  JSAMPLE *pJVar8;
  int ci;
  JDIMENSION num_cols;
  int num_components;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr3;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW inptr;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  iVar1 = cinfo->num_components;
  uVar2 = cinfo->output_width;
  num_rows_local = num_rows;
  output_buf_local = output_buf;
  input_row_local = input_row;
  if (iVar1 == 3) {
    while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
      pJVar3 = (*input_buf)[input_row_local];
      pJVar4 = input_buf[1][input_row_local];
      pJVar5 = input_buf[2][input_row_local];
      input_row_local = input_row_local + 1;
      ppJVar7 = output_buf_local + 1;
      outptr = *output_buf_local;
      for (col = 0; output_buf_local = ppJVar7, col < uVar2; col = col + 1) {
        *outptr = pJVar3[col];
        pJVar8 = outptr + 2;
        outptr[1] = pJVar4[col];
        outptr = outptr + 3;
        *pJVar8 = pJVar5[col];
      }
    }
  }
  else {
    output_buf_local = output_buf;
    if (iVar1 == 4) {
      while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
        pJVar3 = (*input_buf)[input_row_local];
        pJVar4 = input_buf[1][input_row_local];
        pJVar5 = input_buf[2][input_row_local];
        pJVar6 = input_buf[3][input_row_local];
        input_row_local = input_row_local + 1;
        ppJVar7 = output_buf_local + 1;
        outptr = *output_buf_local;
        for (col = 0; output_buf_local = ppJVar7, col < uVar2; col = col + 1) {
          *outptr = pJVar3[col];
          outptr[1] = pJVar4[col];
          pJVar8 = outptr + 3;
          outptr[2] = pJVar5[col];
          outptr = outptr + 4;
          *pJVar8 = pJVar6[col];
        }
      }
    }
    else {
      while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
        for (ci = 0; ci < iVar1; ci = ci + 1) {
          pJVar3 = input_buf[ci][input_row_local];
          outptr = *output_buf_local;
          for (col = 0; col < uVar2; col = col + 1) {
            outptr[ci] = pJVar3[col];
            outptr = outptr + iVar1;
          }
        }
        output_buf_local = output_buf_local + 1;
        input_row_local = input_row_local + 1;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
             JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr, outptr0, outptr1, outptr2, outptr3;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  if (nc == 3) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
      }
    }
  } else if (nc == 4) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      outptr3 = output_buf[3][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
        outptr3[col] = *inptr++;
      }
    }
  } else {
    while (--num_rows >= 0) {
      /* It seems fastest to make a separate pass for each component. */
      for (ci = 0; ci < nc; ci++) {
        inptr = *input_buf;
        outptr = output_buf[ci][output_row];
        for (col = 0; col < num_cols; col++) {
          outptr[col] = inptr[ci];
          inptr += nc;
        }
      }
      input_buf++;
      output_row++;
    }
  }
}